

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chess.cpp
# Opt level: O1

void __thiscall Interface::Run(Interface *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostream *poVar2;
  istream *piVar3;
  char cVar4;
  int iVar5;
  undefined8 uVar6;
  string sInputLine;
  string local_48;
  
  poVar2 = this->m_Out + *(long *)(*(long *)this->m_Out + -0x18) + 0x18;
  *(uint *)poVar2 = *(uint *)poVar2 | 0x2000;
  paVar1 = &local_48.field_2;
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  local_48._M_dataplus._M_p = (pointer)paVar1;
  RegisterAll(this);
  AnnounceSelf(this);
  if (this->m_bIsRunning == true) {
    do {
      piVar3 = this->m_In;
      cVar4 = std::ios::widen((char)*(undefined8 *)(*(long *)piVar3 + -0x18) + (char)piVar3);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                (piVar3,(string *)&local_48,cVar4);
      iVar5 = pthread_mutex_lock((pthread_mutex_t *)&this->m_Lock);
      if (iVar5 != 0) {
        uVar6 = std::__throw_system_error(iVar5);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != paVar1) {
          operator_delete(local_48._M_dataplus._M_p);
        }
        _Unwind_Resume(uVar6);
      }
      Execute(this,&local_48);
      pthread_mutex_unlock((pthread_mutex_t *)&this->m_Lock);
    } while (this->m_bIsRunning != false);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Run()
    {
        m_Out->setf( ios::unitbuf );
        string sInputLine;
        RegisterAll();

        AnnounceSelf();

        while ( m_bIsRunning )
        {
            getline( *m_In, sInputLine );
            if ( m_bLogInputToFile )
                LogLineToFile( sInputLine );

            LockGuardType guard( m_Lock );
            Execute( sInputLine );
        }
    }